

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_progress_handler(sqlite3 *db,int nOps,_func_int_void_ptr *xProgress,void *pArg)

{
  void *pArg_local;
  _func_int_void_ptr *xProgress_local;
  int nOps_local;
  sqlite3 *db_local;
  
  sqlite3_mutex_enter(db->mutex);
  if (nOps < 1) {
    db->xProgress = (_func_int_void_ptr *)0x0;
    db->nProgressOps = 0;
    db->pProgressArg = (void *)0x0;
  }
  else {
    db->xProgress = xProgress;
    db->nProgressOps = nOps;
    db->pProgressArg = pArg;
  }
  sqlite3_mutex_leave(db->mutex);
  return;
}

Assistant:

SQLITE_API void sqlite3_progress_handler(
  sqlite3 *db, 
  int nOps,
  int (*xProgress)(void*), 
  void *pArg
){
  sqlite3_mutex_enter(db->mutex);
  if( nOps>0 ){
    db->xProgress = xProgress;
    db->nProgressOps = nOps;
    db->pProgressArg = pArg;
  }else{
    db->xProgress = 0;
    db->nProgressOps = 0;
    db->pProgressArg = 0;
  }
  sqlite3_mutex_leave(db->mutex);
}